

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosMath.cpp
# Opt level: O1

Box<Dims> *
adios2::helper::IntersectionBox(Box<Dims> *__return_storage_ptr__,Box<Dims> *box1,Box<Dims> *box2)

{
  pointer puVar1;
  ulong uVar2;
  ulong uVar3;
  pointer puVar4;
  iterator iVar5;
  long lVar6;
  size_type __n;
  long lVar7;
  long lVar8;
  
  (__return_storage_ptr__->second).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->second).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->first).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->second).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->first).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->first).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar4 = (box1->first).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (box1->first).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __n = (long)puVar1 - (long)puVar4 >> 3;
  if (puVar1 != puVar4) {
    lVar6 = 0;
    do {
      if ((box1->second).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[lVar6] <
          (box2->first).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[lVar6]) {
        return __return_storage_ptr__;
      }
      if ((box2->second).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[lVar6] < puVar4[lVar6]) {
        return __return_storage_ptr__;
      }
      lVar6 = lVar6 + 1;
    } while (__n + (__n == 0) != lVar6);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&__return_storage_ptr__->first,__n);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&__return_storage_ptr__->second,__n);
  if (puVar1 != puVar4) {
    lVar7 = __n + (__n == 0);
    lVar6 = 0;
    lVar8 = 0;
    do {
      puVar4 = (box1->first).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar2 = *(ulong *)((long)puVar4 + lVar6);
      puVar1 = (box2->first).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar3 = *(ulong *)((long)puVar1 + lVar6);
      if (uVar2 < uVar3) {
        iVar5._M_current =
             (__return_storage_ptr__->first).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (__return_storage_ptr__->first).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          puVar4 = puVar1 + lVar8;
          goto LAB_003faf73;
        }
        *iVar5._M_current = uVar3;
LAB_003faf60:
        (__return_storage_ptr__->first).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      else {
        iVar5._M_current =
             (__return_storage_ptr__->first).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current !=
            (__return_storage_ptr__->first).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          *iVar5._M_current = uVar2;
          goto LAB_003faf60;
        }
        puVar4 = (pointer)((long)puVar4 + lVar6);
LAB_003faf73:
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)__return_storage_ptr__,
                   iVar5,puVar4);
      }
      puVar4 = (box1->second).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar2 = *(ulong *)((long)puVar4 + lVar6);
      puVar1 = (box2->second).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar3 = *(ulong *)((long)puVar1 + lVar6);
      if (uVar3 < uVar2) {
        iVar5._M_current =
             (__return_storage_ptr__->second).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (__return_storage_ptr__->second).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          puVar4 = puVar1 + lVar8;
          goto LAB_003fafbf;
        }
        *iVar5._M_current = uVar3;
LAB_003fafac:
        (__return_storage_ptr__->second).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      else {
        iVar5._M_current =
             (__return_storage_ptr__->second).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current !=
            (__return_storage_ptr__->second).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          *iVar5._M_current = uVar2;
          goto LAB_003fafac;
        }
        puVar4 = (pointer)((long)puVar4 + lVar6);
LAB_003fafbf:
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                   &__return_storage_ptr__->second,iVar5,puVar4);
      }
      lVar8 = lVar8 + 1;
      lVar6 = lVar6 + 8;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

Box<Dims> IntersectionBox(const Box<Dims> &box1, const Box<Dims> &box2) noexcept
{
    Box<Dims> intersectionBox;
    const size_t dimensionsSize = box1.first.size();

    for (size_t d = 0; d < dimensionsSize; ++d)
    {
        // Don't intercept
        if (box2.first[d] > box1.second[d] || box2.second[d] < box1.first[d])
        {
            return intersectionBox;
        }
    }

    // get the intersection box
    intersectionBox.first.reserve(dimensionsSize);
    intersectionBox.second.reserve(dimensionsSize);

    for (size_t d = 0; d < dimensionsSize; ++d)
    {
        // start
        if (box1.first[d] < box2.first[d])
        {
            intersectionBox.first.push_back(box2.first[d]);
        }
        else
        {
            intersectionBox.first.push_back(box1.first[d]);
        }

        // end, must be inclusive
        if (box1.second[d] > box2.second[d])
        {
            intersectionBox.second.push_back(box2.second[d]);
        }
        else
        {
            intersectionBox.second.push_back(box1.second[d]);
        }
    }

    return intersectionBox;
}